

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O3

_Bool effect_handler_MAP_AREA(effect_handler_context_t_conflict *context)

{
  ulong uVar1;
  short sVar2;
  short sVar3;
  player_upkeep *ppVar4;
  int iVar5;
  chunk_conflict *pcVar6;
  _Bool _Var7;
  loc lVar8;
  loc lVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  bool bVar15;
  source origin;
  int local_50;
  
  iVar12 = context->y;
  if (iVar12 == 0) {
    iVar12 = (context->value).dice;
  }
  iVar13 = context->x;
  if (iVar13 == 0) {
    iVar13 = (context->value).sides;
  }
  origin._4_4_ = 0;
  origin.what = (context->origin).what;
  origin.which.trap = (context->origin).which.trap;
  lVar8 = origin_get_loc(origin);
  iVar10 = lVar8.x - iVar13;
  iVar13 = iVar13 + lVar8.x;
  iVar11 = lVar8.y - iVar12;
  iVar12 = iVar12 + lVar8.y;
  if (iVar11 < 1) {
    iVar11 = 0;
  }
  if (iVar10 < 1) {
    iVar10 = 0;
  }
  iVar5 = cave->height + -1;
  if (iVar12 < cave->height) {
    iVar5 = iVar12;
  }
  iVar12 = cave->width + -1;
  if (iVar13 < cave->width) {
    iVar12 = iVar13;
  }
  local_50 = iVar11;
  if (iVar11 < iVar5) {
    do {
      iVar13 = iVar10;
      if (iVar10 < iVar12) {
        do {
          lVar8 = (loc)loc(iVar13,local_50);
          _Var7 = square_isno_map(cave,lVar8);
          if (!_Var7) {
            _Var7 = square_seemslikewall(cave,lVar8);
            if (!_Var7) {
              _Var7 = square_in_bounds_fully(cave,lVar8);
              if (!_Var7) goto LAB_0013e656;
              _Var7 = square_isfloor(cave,lVar8);
              if (!_Var7) {
                square_memorize(cave,lVar8);
              }
              lVar14 = 0;
              do {
                pcVar6 = cave;
                sVar2 = ddy_ddd[lVar14];
                sVar3 = ddx_ddd[lVar14];
                lVar9 = (loc)loc(sVar3 + iVar13,sVar2 + local_50);
                _Var7 = square_seemslikewall(pcVar6,lVar9);
                pcVar6 = cave;
                if (_Var7) {
                  lVar9 = (loc)loc(sVar3 + iVar13,sVar2 + local_50);
                  square_memorize(pcVar6,lVar9);
                }
                lVar14 = lVar14 + 1;
              } while (lVar14 != 8);
            }
            _Var7 = square_ismemorybad(cave,lVar8);
            if (_Var7) {
              square_forget(cave,lVar8);
            }
          }
LAB_0013e656:
          iVar13 = iVar13 + 1;
        } while (iVar13 != iVar12);
      }
      local_50 = local_50 + 1;
    } while (local_50 != iVar5);
  }
  if (iVar11 + -1 <= iVar5) {
    iVar13 = iVar11 + -1;
    do {
      iVar11 = iVar10 + -1;
      if (iVar10 + -1 <= iVar12) {
        do {
          lVar8 = (loc)loc(iVar11,iVar13);
          _Var7 = square_in_bounds(cave,lVar8);
          if (_Var7) {
            square_unmark(cave,lVar8);
          }
          bVar15 = iVar11 != iVar12;
          iVar11 = iVar11 + 1;
        } while (bVar15);
      }
      bVar15 = iVar13 != iVar5;
      iVar13 = iVar13 + 1;
    } while (bVar15);
  }
  ppVar4 = player->upkeep;
  uVar1._0_4_ = ppVar4->update;
  uVar1._4_4_ = ppVar4->redraw;
  ppVar4->update = (int)(uVar1 | 0xc10000000000c0);
  ppVar4->redraw = (int)((uVar1 | 0xc10000000000c0) >> 0x20);
  context->ident = true;
  return true;
}

Assistant:

bool effect_handler_MAP_AREA(effect_handler_context_t *context)
{
	int i, x, y;
	int x1, x2, y1, y2;
	int dist_y = context->y ? context->y : context->value.dice;
	int dist_x = context->x ? context->x : context->value.sides;
	struct loc centre = origin_get_loc(context->origin);

	/* Pick an area to map */
	y1 = centre.y - dist_y;
	y2 = centre.y + dist_y;
	x1 = centre.x - dist_x;
	x2 = centre.x + dist_x;

	/* Drag the co-ordinates into the dungeon */
	if (y1 < 0) y1 = 0;
	if (x1 < 0) x1 = 0;
	if (y2 > cave->height - 1) y2 = cave->height - 1;
	if (x2 > cave->width - 1) x2 = cave->width - 1;

	/* Scan the dungeon */
	for (y = y1; y < y2; y++) {
		for (x = x1; x < x2; x++) {
			struct loc grid = loc(x, y);

			/* Some squares can't be mapped */
			if (square_isno_map(cave, grid)) continue;

			/* All non-walls are "checked" */
			if (!square_seemslikewall(cave, grid)) {
				if (!square_in_bounds_fully(cave, grid)) continue;

				/* Memorize normal features */
				if (!square_isfloor(cave, grid))
					square_memorize(cave, grid);

				/* Memorize known walls */
				for (i = 0; i < 8; i++) {
					int yy = y + ddy_ddd[i];
					int xx = x + ddx_ddd[i];

					/* Memorize walls (etc) */
					if (square_seemslikewall(cave, loc(xx, yy)))
						square_memorize(cave, loc(xx, yy));
				}
			}

			/*
			 * Forget grids that are both unprocessed and
			 * misremembered in the mapping area.
			 */
			if (square_ismemorybad(cave, grid)) {
				square_forget(cave, grid);
			}
		}
	}

	/* Unmark grids */
	for (y = y1 - 1; y < y2 + 1; y++) {
		for (x = x1 - 1; x < x2 + 1; x++) {
			struct loc grid = loc(x, y);
			if (!square_in_bounds(cave, grid)) continue;
			square_unmark(cave, grid);
		}
	}

	/* Fully update the visuals */
	player->upkeep->update |= (PU_UPDATE_VIEW | PU_MONSTERS);

	/* Redraw whole map, monster list */
	player->upkeep->redraw |= (PR_MAP | PR_MONLIST | PR_ITEMLIST);

	/* Notice */
	context->ident = true;

	return true;
}